

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O2

int mg_secure_transport_init
              (int sockfd,char *cert_file,char *key_file,mg_secure_transport **transport,
              mg_allocator *allocator)

{
  int iVar1;
  SSL_METHOD *meth;
  SSL_CTX *ctx;
  SSL *s;
  BIO *rbio;
  X509 *x;
  EVP_PKEY *pkey;
  EVP_MD *type;
  char *pcVar2;
  ulong uVar3;
  byte *md;
  uint peer_pubkey_fp_len;
  char *local_90;
  mg_secure_transport *local_88;
  mg_secure_transport **local_80;
  uchar peer_pubkey_fp [64];
  
  ERR_clear_error();
  meth = (SSL_METHOD *)TLS_client_method();
  ctx = SSL_CTX_new(meth);
  if (ctx == (SSL_CTX *)0x0) {
    rbio = (BIO *)0x0;
    s = (SSL *)0x0;
LAB_0010887c:
    ctx = (SSL_CTX *)0x0;
  }
  else {
    if ((key_file == (char *)0x0 || cert_file == (char *)0x0) ||
       ((iVar1 = SSL_CTX_use_certificate_chain_file(ctx,cert_file), iVar1 == 1 &&
        (iVar1 = SSL_CTX_use_PrivateKey_file(ctx,key_file,1), iVar1 == 1)))) {
      SSL_CTX_set_options(ctx);
      s = SSL_new(ctx);
      if (s != (SSL *)0x0) {
        SSL_CTX_free(ctx);
        ctx = (SSL_CTX *)0x0;
        rbio = BIO_new_socket(sockfd,0);
        if (rbio != (BIO *)0x0) {
          SSL_set_bio(s,rbio,rbio);
          iVar1 = SSL_connect(s);
          if (-1 < iVar1) {
            local_80 = transport;
            x = (X509 *)SSL_get1_peer_certificate(s);
            pkey = X509_get_pubkey(x);
            iVar1 = EVP_PKEY_get_base_id(pkey);
            EVP_PKEY_free(pkey);
            if (iVar1 == 0) {
              local_90 = "UNKNOWN";
            }
            else {
              local_90 = OBJ_nid2ln(iVar1);
            }
            type = EVP_sha512();
            md = peer_pubkey_fp;
            iVar1 = X509_pubkey_digest(x,type,md,&peer_pubkey_fp_len);
            X509_free(x);
            if (iVar1 == 1) {
              local_88 = (mg_secure_transport *)mg_allocator_malloc(allocator,0x50);
              if (local_88 != (mg_secure_transport *)0x0) {
                BIO_ctrl(rbio,9,1,(void *)0x0);
                local_88->ssl = (SSL *)s;
                local_88->bio = (BIO *)rbio;
                local_88->peer_pubkey_type = local_90;
                pcVar2 = (char *)mg_allocator_malloc(allocator,(ulong)(peer_pubkey_fp_len * 2 + 1));
                for (uVar3 = 0; (ulong)peer_pubkey_fp_len * 2 != uVar3; uVar3 = uVar3 + 2) {
                  sprintf(pcVar2 + (uVar3 & 0xffffffff),"%02x",(ulong)*md);
                  md = md + 1;
                }
                local_88->peer_pubkey_fp = pcVar2;
                local_88->send = mg_secure_transport_send;
                local_88->recv = mg_secure_transport_recv;
                local_88->suspend_until_ready_to_read = (_func_void_mg_transport_ptr *)0x0;
                local_88->suspend_until_ready_to_write = (_func_void_mg_transport_ptr *)0x0;
                local_88->destroy = mg_secure_transport_destroy;
                local_88->allocator = allocator;
                *local_80 = local_88;
                return 0;
              }
              iVar1 = -3;
              ctx = (SSL_CTX *)0x0;
              goto LAB_00108895;
            }
          }
          goto LAB_0010887c;
        }
        rbio = (BIO *)0x0;
        goto LAB_0010887f;
      }
    }
    rbio = (BIO *)0x0;
    s = (SSL *)0x0;
  }
LAB_0010887f:
  ERR_print_errors_cb(print_ssl_error,"mg_secure_transport_init");
  iVar1 = -0x11;
LAB_00108895:
  SSL_CTX_free(ctx);
  if (s == (SSL *)0x0) {
    BIO_free(rbio);
  }
  else {
    SSL_free(s);
  }
  return iVar1;
}

Assistant:

int mg_secure_transport_init(int sockfd, const char *cert_file,
                             const char *key_file,
                             mg_secure_transport **transport,
                             mg_allocator *allocator) {
  mg_openssl_init();

  SSL_CTX *ctx = NULL;
  SSL *ssl = NULL;
  BIO *bio = NULL;

  int status = 0;

  ERR_clear_error();

#if OPENSSL_VERSION_NUMBER < 0x10100000L
  ctx = SSL_CTX_new(SSLv23_client_method());
#else
  ctx = SSL_CTX_new(TLS_client_method());
#endif

  if (!ctx) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  if (cert_file && key_file) {
    if (SSL_CTX_use_certificate_chain_file(ctx, cert_file) != 1 ||
        SSL_CTX_use_PrivateKey_file(ctx, key_file, SSL_FILETYPE_PEM) != 1) {
      status = MG_ERROR_SSL_ERROR;
      goto failure;
    }
  }

  SSL_CTX_set_options(ctx, SSL_OP_NO_SSLv3);
  ssl = SSL_new(ctx);

  if (!ssl) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // SSL_CTX object is reference counted, we're destroying this local reference,
  // but reference from SSL object stays.
  SSL_CTX_free(ctx);
  ctx = NULL;

  bio = BIO_new_socket(sockfd, BIO_NOCLOSE);
  if (!bio) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }
  SSL_set_bio(ssl, bio, bio);

  int ret = SSL_connect(ssl);
  if (ret < 0) {
    status = MG_ERROR_SSL_ERROR;
    goto failure;
  }

  // Get server's public key type and fingerprint.
  X509 *peer_cert = SSL_get_peer_certificate(ssl);
  assert(peer_cert);
  EVP_PKEY *peer_pubkey = X509_get_pubkey(peer_cert);
  int nid = EVP_PKEY_base_id(peer_pubkey);
  EVP_PKEY_free(peer_pubkey);
  const char *peer_pubkey_type =
      (nid == NID_undef) ? "UNKNOWN" : OBJ_nid2ln(nid);
  unsigned char peer_pubkey_fp[EVP_MAX_MD_SIZE];
  unsigned int peer_pubkey_fp_len;
  if (X509_pubkey_digest(peer_cert, EVP_sha512(), peer_pubkey_fp,
                         &peer_pubkey_fp_len) != 1) {
    status = MG_ERROR_SSL_ERROR;
    X509_free(peer_cert);
    goto failure;
  }
  X509_free(peer_cert);

  mg_secure_transport *ttransport =
      mg_allocator_malloc(allocator, sizeof(mg_secure_transport));
  if (!ttransport) {
    status = MG_ERROR_OOM;
    goto failure;
  }

  // Take ownership of the socket now that everything went well.
  BIO_set_close(bio, BIO_CLOSE);

  ttransport->ssl = ssl;
  ttransport->bio = bio;
  ttransport->peer_pubkey_type = peer_pubkey_type;
  ttransport->peer_pubkey_fp =
      hex_encode(peer_pubkey_fp, peer_pubkey_fp_len, allocator);
  ttransport->send = mg_secure_transport_send;
  ttransport->recv = mg_secure_transport_recv;
  ttransport->suspend_until_ready_to_read = NULL;
  ttransport->suspend_until_ready_to_write = NULL;
  ttransport->destroy = mg_secure_transport_destroy;
  ttransport->allocator = allocator;
  *transport = ttransport;

  return 0;

failure:
  if (status == MG_ERROR_SSL_ERROR) {
    ERR_print_errors_cb(print_ssl_error, "mg_secure_transport_init");
  }
  SSL_CTX_free(ctx);
  if (ssl) {
    // If SSL object was successfuly created, it owns the BIO so we don't need
    // to destroy it.
    SSL_free(ssl);
  } else {
    BIO_free(bio);
  }

  return status;
}